

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_udp.c
# Opt level: O3

int csp_if_udp_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  void *pvVar1;
  undefined4 in_register_0000000c;
  undefined6 in_register_00000032;
  
  pvVar1 = iface->driver_data;
  if (*(int *)((long)pvVar1 + 0x28) == 0) {
    csp_print_func("Sockfd null\n",CONCAT62(in_register_00000032,via),packet,
                   CONCAT44(in_register_0000000c,from_me));
  }
  else {
    csp_id_prepend(packet);
    *(undefined2 *)((long)pvVar1 + 0x18) = 2;
    *(ushort *)((long)pvVar1 + 0x1a) =
         *(ushort *)((long)pvVar1 + 0xc) << 8 | *(ushort *)((long)pvVar1 + 0xc) >> 8;
    sendto(*(int *)((long)pvVar1 + 0x28),(packet->field_0).field_1.frame_begin,
           (ulong)(packet->field_0).field_1.frame_length,0x800,(sockaddr *)((long)pvVar1 + 0x18),
           0x10);
  }
  csp_buffer_free(packet);
  return 0;
}

Assistant:

static int csp_if_udp_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	csp_if_udp_conf_t * ifconf = iface->driver_data;

	if (ifconf->sockfd == 0) {
		csp_print("Sockfd null\n");
		csp_buffer_free(packet);
		return CSP_ERR_NONE;
	}

	csp_id_prepend(packet);
	ifconf->peer_addr.sin_family = AF_INET;
	ifconf->peer_addr.sin_port = htons(ifconf->rport);
	sendto(ifconf->sockfd, packet->frame_begin, packet->frame_length, MSG_CONFIRM, (struct sockaddr *)&ifconf->peer_addr, sizeof(ifconf->peer_addr));
	csp_buffer_free(packet);

	return CSP_ERR_NONE;
}